

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O1

void multikey_cache8(uchar **strings,size_t n)

{
  Cacheblock<8U>_conflict *cache;
  uchar **ppuVar1;
  size_t sVar2;
  
  cache = (Cacheblock<8U>_conflict *)malloc(n << 4);
  if (n == 0) {
    multikey_cache<8u,true>(cache,0,0);
  }
  else {
    ppuVar1 = &cache->ptr;
    sVar2 = 0;
    do {
      *ppuVar1 = strings[sVar2];
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (n != sVar2);
    sVar2 = 0;
    multikey_cache<8u,true>(cache,n,0);
    ppuVar1 = &cache->ptr;
    do {
      strings[sVar2] = *ppuVar1;
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (n != sVar2);
  }
  free(cache);
  return;
}

Assistant:

void multikey_cache8(unsigned char** strings, size_t n)
{ multikey_cache<8>(strings, n, 0); }